

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O2

void __thiscall QCborStreamReader::addData(QCborStreamReader *this,char *data,qsizetype len)

{
  long in_FS_OFFSET;
  QMessageLogger local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (**(long **)(this + 8) == 0) {
    if (0 < len) {
      QByteArray::append((QByteArray *)(*(long **)(this + 8) + 1),data,len);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      reparse(this);
      return;
    }
  }
  else {
    local_30.context.version = 2;
    local_30.context.function._4_4_ = 0;
    local_30.context._4_8_ = 0;
    local_30.context._12_8_ = 0;
    local_30.context.category = "default";
    QMessageLogger::warning(&local_30,"QCborStreamReader: addData() with device()");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QCborStreamReader::addData(const char *data, qsizetype len)
{
    if (!d->device) {
        if (len > 0)
            d->buffer.append(data, len);
        reparse();
    } else {
        qWarning("QCborStreamReader: addData() with device()");
    }
}